

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

void __thiscall cppurses::Text_display::clear(Text_display *this)

{
  Cursor_data *this_00;
  pointer pGVar1;
  pointer pGVar2;
  pointer pGVar3;
  
  pGVar1 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar2 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pGVar3 = pGVar1;
  if (pGVar2 != pGVar1) {
    do {
      if ((pGVar3->brush).foreground_color_.initialized_ == true) {
        (pGVar3->brush).foreground_color_.initialized_ = false;
      }
      if ((pGVar3->brush).background_color_.initialized_ == true) {
        (pGVar3->brush).background_color_.initialized_ = false;
      }
      pGVar3 = pGVar3 + 1;
    } while (pGVar3 != pGVar2);
    (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
    super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar1;
  }
  this_00 = &(this->super_Widget).cursor;
  Cursor_data::set_x(this_00,0);
  Cursor_data::set_y(this_00,0);
  (*(this->super_Widget)._vptr_Widget[3])(this);
  sig::
  Signal_impl<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
  ::operator()((Signal_impl<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
                *)(this->contents_modified).pimpl_.
                  super___shared_ptr<sig::Signal_impl<void_(const_cppurses::Glyph_string_&),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(const_cppurses::Glyph_string_&)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&this->contents_);
  return;
}

Assistant:

void Text_display::clear() {
    contents_.clear();
    this->cursor.set_x(0);
    this->cursor.set_y(0);
    this->update();
    contents_modified(contents_);
}